

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

size_t __thiscall embree::SceneGraph::SubdivMeshNode::numBytes(SubdivMeshNode *this)

{
  long lVar1;
  SubdivMeshNode *this_00;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  long *in_RDI;
  
  lVar1 = (**(code **)(*in_RDI + 0x70))();
  this_00 = (SubdivMeshNode *)(lVar1 << 2);
  sVar2 = numEdges((SubdivMeshNode *)0x1e9cdb);
  sVar3 = numPositions(this_00);
  sVar4 = numTimeSteps((SubdivMeshNode *)0x1e9d07);
  return (long)&(&(this_00->super_Node).super_RefCount)[sVar3 * sVar4]._vptr_RefCount + sVar2 * 4;
}

Assistant:

size_t numBytes() const {
        return numPrimitives()*sizeof(unsigned) + numEdges()*sizeof(unsigned) + numPositions()*numTimeSteps()*sizeof(Vertex);
      }